

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_xts_decode_keys
              (uchar *key,uint keybits,uchar **key1,uint *key1bits,uchar **key2,uint *key2bits)

{
  uint half_keybytes;
  uint half_keybits;
  uint *key2bits_local;
  uchar **key2_local;
  uint *key1bits_local;
  uchar **key1_local;
  uint keybits_local;
  uchar *key_local;
  
  if ((keybits == 0x100) || (keybits == 0x200)) {
    *key1bits = keybits >> 1;
    *key2bits = keybits >> 1;
    *key1 = key;
    *key2 = key + (keybits >> 4);
    key_local._4_4_ = 0;
  }
  else {
    key_local._4_4_ = -0x20;
  }
  return key_local._4_4_;
}

Assistant:

static int mbedtls_aes_xts_decode_keys( const unsigned char *key,
                                        unsigned int keybits,
                                        const unsigned char **key1,
                                        unsigned int *key1bits,
                                        const unsigned char **key2,
                                        unsigned int *key2bits )
{
    const unsigned int half_keybits = keybits / 2;
    const unsigned int half_keybytes = half_keybits / 8;

    switch( keybits )
    {
        case 256: break;
        case 512: break;
        default : return( MBEDTLS_ERR_AES_INVALID_KEY_LENGTH );
    }

    *key1bits = half_keybits;
    *key2bits = half_keybits;
    *key1 = &key[0];
    *key2 = &key[half_keybytes];

    return 0;
}